

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::str_writer<fmt::v5::char8_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
           *this,align_spec *spec,str_writer<fmt::v5::char8_t> *f)

{
  size_t n;
  size_t sVar1;
  undefined8 in_RAX;
  size_t sVar2;
  type pcVar3;
  char8_t *pcVar4;
  ulong uVar5;
  ptrdiff_t _Num_2;
  ptrdiff_t _Num_1;
  ulong uVar6;
  char_type fill;
  undefined8 uStack_38;
  
  uVar5 = (ulong)spec->width_;
  n = f->size_;
  sVar2 = n;
  uStack_38 = in_RAX;
  if (uVar5 != 0) {
    sVar2 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
            ::str_writer<fmt::v5::char8_t>::width(f);
  }
  uVar6 = uVar5 - sVar2;
  if (uVar5 < sVar2 || uVar6 == 0) {
    pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_> *)
                        this,n);
    if (f->size_ != 0) {
      memmove(pcVar3,f->s,f->size_);
      return;
    }
  }
  else {
    pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_> *)
                        this,(n + uVar5) - sVar2);
    uStack_38 = CONCAT17((char)spec->fill_,(undefined7)uStack_38);
    if (spec->align_ == ALIGN_CENTER) {
      pcVar4 = std::__fill_n_a<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
                         (pcVar3,uVar6 >> 1,(long)&uStack_38 + 7);
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(pcVar4,f->s,sVar1);
      }
      pcVar3 = pcVar4 + sVar1;
      uVar6 = uVar6 - (uVar6 >> 1);
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pcVar4 = std::__fill_n_a<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
                           (pcVar3,uVar6,(long)&uStack_38 + 7);
        if (f->size_ == 0) {
          return;
        }
        memmove(pcVar4,f->s,f->size_);
        return;
      }
      sVar1 = f->size_;
      if (sVar1 != 0) {
        memmove(pcVar3,f->s,sVar1);
      }
      pcVar3 = pcVar3 + sVar1;
    }
    std::__fill_n_a<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
              (pcVar3,uVar6,(long)&uStack_38 + 7);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }